

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O2

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinSCANL_X,void>::
eval_exc_<int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinSCANL_X,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  const_host_buffer_type lapl;
  const_host_buffer_type tau;
  host_buffer_type eps;
  ulong uVar1;
  ulong uVar2;
  
  N = *args;
  rho = *args_1;
  sigma = *args_2;
  lapl = *args_3;
  tau = *args_4;
  eps = *args_5;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_helper_polar<ExchCXX::BuiltinSCANL_X>(N,rho,sigma,lapl,tau,eps);
    return;
  }
  uVar1 = 0;
  uVar2 = (ulong)N;
  if ((int)N < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 8 != uVar1; uVar1 = uVar1 + 8) {
    kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinSCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
    eval_exc_unpolar(*(double *)((long)rho + uVar1),*(double *)((long)sigma + uVar1),
                     *(double *)((long)lapl + uVar1),*(double *)((long)tau + uVar1),
                     (double *)((long)eps + uVar1));
  }
  return;
}

Assistant:

void eval_exc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }